

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * anon_unknown.dwarf_20a43d::CheckType(ExpressionContext *ctx,ExprBase *expr,VmValue *value)

{
  uint __line;
  char *__assertion;
  VmType VVar1;
  
  VVar1 = GetVmType(ctx,expr->type);
  if (((value->type).type == VVar1.type) && ((value->type).size == VVar1.size)) {
    if (VVar1.structType == (value->type).structType) {
      return value;
    }
    __assertion = "exprType.structType == value->type.structType";
    __line = 0x1b;
  }
  else {
    __assertion = "exprType == value->type";
    __line = 0x1a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,__line,
                "VmValue *(anonymous namespace)::CheckType(ExpressionContext &, ExprBase *, VmValue *)"
               );
}

Assistant:

VmValue* CheckType(ExpressionContext &ctx, ExprBase* expr, VmValue *value)
	{
		VmType exprType = GetVmType(ctx, expr->type);

		(void)exprType;

		assert(exprType == value->type);
		assert(exprType.structType == value->type.structType);

		return value;
	}